

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateCustomLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  bool bVar1;
  CustomLayerParams *pCVar2;
  long lVar3;
  string *psVar4;
  RepeatedPtrField<CoreML::Specification::WeightParams> *this_00;
  Result local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  undefined1 local_130 [8];
  string err_1;
  WeightParams *param;
  const_iterator __end1;
  const_iterator __begin1;
  RepeatedPtrField<CoreML::Specification::WeightParams> *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 local_c8 [8];
  string err;
  Result local_70;
  undefined1 local_48 [8];
  Result r;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  
  r.m_message.field_2._8_8_ = layer;
  Result::Result((Result *)local_48);
  validateInputCount(&local_70,(NeuralNetworkLayer *)r.m_message.field_2._8_8_,1,-1);
  Result::operator=((Result *)local_48,&local_70);
  Result::~Result(&local_70);
  bVar1 = Result::good((Result *)local_48);
  if (bVar1) {
    validateOutputCount((Result *)((long)&err.field_2 + 8),
                        (NeuralNetworkLayer *)r.m_message.field_2._8_8_,1,-1);
    Result::operator=((Result *)local_48,(Result *)((long)&err.field_2 + 8));
    Result::~Result((Result *)((long)&err.field_2 + 8));
  }
  pCVar2 = Specification::NeuralNetworkLayer::custom
                     ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
  Specification::CustomLayerParams::classname_abi_cxx11_(pCVar2);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 == 0) {
    psVar4 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                       ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
    std::operator+(&local_e8,"Custom layer ",psVar4);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                   &local_e8,
                   " has an empty \'className\' field. This field is required in order for Core ML to link to the implementation for this custom class."
                  );
    std::__cxx11::string::~string((string *)&local_e8);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_c8);
    std::__cxx11::string::~string((string *)local_c8);
  }
  else {
    pCVar2 = Specification::NeuralNetworkLayer::custom
                       ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
    this_00 = Specification::CustomLayerParams::weights(pCVar2);
    __end1 = google::protobuf::RepeatedPtrField<CoreML::Specification::WeightParams>::begin(this_00)
    ;
    param = (WeightParams *)
            google::protobuf::RepeatedPtrField<CoreML::Specification::WeightParams>::end(this_00);
    while (bVar1 = google::protobuf::internal::
                   RepeatedPtrIterator<const_CoreML::Specification::WeightParams>::operator!=
                             (&__end1,(iterator *)&param), bVar1) {
      err_1.field_2._8_8_ =
           google::protobuf::internal::
           RepeatedPtrIterator<const_CoreML::Specification::WeightParams>::operator*(&__end1);
      bVar1 = checkSingleWeightType((WeightParams *)err_1.field_2._8_8_);
      if (!bVar1) {
        psVar4 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                           ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
        std::operator+(&local_150,"Custom layer ",psVar4);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_130,&local_150,
                       " has a weights parameter with multiple types filled in.  The WeightParams message should be treated as a oneof."
                      );
        std::__cxx11::string::~string((string *)&local_150);
        Result::Result(&local_178,INVALID_MODEL_PARAMETERS,(string *)local_130);
        Result::operator=((Result *)local_48,&local_178);
        Result::~Result(&local_178);
        std::__cxx11::string::~string((string *)local_130);
      }
      google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::WeightParams>::
      operator++(&__end1);
    }
    Result::Result(__return_storage_ptr__,(Result *)local_48);
  }
  Result::~Result((Result *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateCustomLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, -1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, -1);
    }

    if (layer.custom().classname().size() == 0) {
        std::string err = "Custom layer " + layer.name() + " has an empty 'className' field. This field is required in order for Core ML to link to the implementation for this custom class.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    for (const auto& param: layer.custom().weights()) {
        if (!checkSingleWeightType(param)) {
            std::string err = "Custom layer " + layer.name() + " has a weights parameter with multiple types filled in.  The WeightParams message should be treated as a oneof.";
            r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }

    return r;
}